

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void setupCornellBox(World *world)

{
  MultiJittered *pMVar1;
  ViewPlane *pVVar2;
  int *piVar3;
  Lambertian *pLVar4;
  pointer pRVar5;
  unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> local_3e0;
  Vector3 local_3d4;
  Vector3 local_3c8;
  Vector3 local_3bc;
  undefined1 local_3b0 [8];
  unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> tall5;
  Vector3 local_39c;
  Vector3 local_390;
  Vector3 local_384;
  undefined1 local_378 [8];
  unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> tall4;
  Vector3 local_364;
  Vector3 local_358;
  Vector3 local_34c;
  undefined1 local_340 [8];
  unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> tall3;
  Vector3 local_32c;
  Vector3 local_320;
  Vector3 local_314;
  undefined1 local_308 [8];
  unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> tall2;
  Vector3 local_2f4;
  Vector3 local_2e8;
  Vector3 local_2dc;
  undefined1 local_2d0 [8];
  unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> tall1;
  Vector3 local_2bc;
  Vector3 local_2b0;
  Vector3 local_2a4;
  undefined1 local_298 [8];
  unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> short5;
  Vector3 local_284;
  Vector3 local_278;
  Vector3 local_26c;
  undefined1 local_260 [8];
  unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> short4;
  Vector3 local_24c;
  Vector3 local_240;
  Vector3 local_234;
  undefined1 local_228 [8];
  unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> short3;
  Vector3 local_214;
  Vector3 local_208;
  Vector3 local_1fc;
  undefined1 local_1f0 [8];
  unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> short2;
  Vector3 local_1cc;
  Vector3 local_1c0;
  Vector3 local_1b4;
  undefined1 local_1a8 [8];
  unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> short1;
  Vector3 local_194;
  Vector3 local_188;
  Vector3 local_17c;
  Rectangle *local_170;
  Rectangle *backWall;
  Vector3 local_15c;
  Vector3 local_150;
  Vector3 local_144;
  Rectangle *local_138;
  Rectangle *rightWall;
  Vector3 local_124;
  Vector3 local_118;
  Vector3 local_10c;
  Rectangle *local_100;
  Rectangle *leftWall;
  Vector3 local_ec;
  Vector3 local_e0;
  Vector3 local_d4;
  Rectangle *local_c8;
  Rectangle *ceiling;
  Vector3 local_b4;
  Vector3 local_a8;
  Vector3 local_9c;
  Rectangle *local_90;
  Rectangle *floor;
  Vector3 local_7c;
  Vector3 local_70;
  Vector3 local_64;
  Rectangle *local_58;
  Rectangle *lightRect;
  Emissive *emissive;
  Matte *green;
  Matte *red;
  Matte *white;
  Sampler *local_28;
  Hammersley *hammersley;
  Sampler *local_18;
  MultiJittered *vpSampler;
  World *world_local;
  
  hammersley._4_4_ = 9;
  vpSampler = (MultiJittered *)world;
  local_18 = &pm::World::createSampler<pm::MultiJittered,int>(world,(int *)((long)&hammersley + 4))
              ->super_Sampler;
  pVVar2 = pm::World::viewPlane((World *)vpSampler);
  pm::ViewPlane::setDimensions(pVVar2,0x500,0x2d0);
  pVVar2 = pm::World::viewPlane((World *)vpSampler);
  pm::ViewPlane::setSampler(pVVar2,local_18);
  pVVar2 = pm::World::viewPlane((World *)vpSampler);
  piVar3 = pm::ViewPlane::editMaxDepth(pVVar2);
  *piVar3 = 5;
  white._4_4_ = 0x100;
  local_28 = &pm::World::createSampler<pm::Hammersley,int>
                        ((World *)vpSampler,(int *)((long)&white + 4))->super_Sampler;
  red = pm::World::createMaterial<pm::Matte>((World *)vpSampler);
  pm::Matte::setCd(red,0.7,0.7,0.7);
  pLVar4 = pm::Matte::ambient(red);
  pm::BRDF::setSampler(&pLVar4->super_BRDF,local_28);
  pLVar4 = pm::Matte::diffuse(red);
  pm::BRDF::setSampler(&pLVar4->super_BRDF,local_28);
  green = pm::World::createMaterial<pm::Matte>((World *)vpSampler);
  pm::Matte::setCd(green,0.7,0.0,0.0);
  pLVar4 = pm::Matte::ambient(green);
  pm::BRDF::setSampler(&pLVar4->super_BRDF,local_28);
  pLVar4 = pm::Matte::diffuse(green);
  pm::BRDF::setSampler(&pLVar4->super_BRDF,local_28);
  emissive = (Emissive *)pm::World::createMaterial<pm::Matte>((World *)vpSampler);
  pm::Matte::setCd((Matte *)emissive,0.0,0.7,0.0);
  pLVar4 = pm::Matte::ambient((Matte *)emissive);
  pm::BRDF::setSampler(&pLVar4->super_BRDF,local_28);
  pLVar4 = pm::Matte::diffuse((Matte *)emissive);
  pm::BRDF::setSampler(&pLVar4->super_BRDF,local_28);
  lightRect = (Rectangle *)pm::World::createMaterial<pm::Emissive>((World *)vpSampler);
  pMVar1 = vpSampler;
  pm::Vector3::Vector3(&local_64,213.0,548.79,227.0);
  pm::Vector3::Vector3(&local_70,130.0,0.0,0.0);
  pm::Vector3::Vector3(&local_7c,0.0,0.0,105.0);
  pm::Vector3::Vector3((Vector3 *)&floor,0.0,-1.0,0.0);
  local_58 = pm::World::createObject<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
                       ((World *)pMVar1,&local_64,&local_70,&local_7c,(Vector3 *)&floor);
  pm::Rectangle::setSampler(local_58,local_28);
  pm::Geometry::setMaterial(&local_58->super_Geometry,(Material *)lightRect);
  pMVar1 = vpSampler;
  pm::Vector3::Vector3(&local_9c,0.0,0.0,0.0);
  pm::Vector3::Vector3(&local_a8,552.8,0.0,0.0);
  pm::Vector3::Vector3(&local_b4,0.0,0.0,559.2);
  pm::Vector3::Vector3((Vector3 *)&ceiling,0.0,1.0,0.0);
  local_90 = pm::World::createObject<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
                       ((World *)pMVar1,&local_9c,&local_a8,&local_b4,(Vector3 *)&ceiling);
  pm::Geometry::setMaterial(&local_90->super_Geometry,&red->super_Material);
  pMVar1 = vpSampler;
  pm::Vector3::Vector3(&local_d4,0.0,548.8,0.0);
  pm::Vector3::Vector3(&local_e0,556.0,0.0,0.0);
  pm::Vector3::Vector3(&local_ec,0.0,0.0,559.2);
  pm::Vector3::Vector3((Vector3 *)&leftWall,0.0,-1.0,0.0);
  local_c8 = pm::World::createObject<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
                       ((World *)pMVar1,&local_d4,&local_e0,&local_ec,(Vector3 *)&leftWall);
  pm::Geometry::setMaterial(&local_c8->super_Geometry,&red->super_Material);
  pMVar1 = vpSampler;
  pm::Vector3::Vector3(&local_10c,552.8,0.0,0.0);
  pm::Vector3::Vector3(&local_118,0.0,548.8,0.0);
  pm::Vector3::Vector3(&local_124,0.0,0.0,559.2);
  pm::Vector3::Vector3((Vector3 *)&rightWall,-1.0,0.0,0.0);
  local_100 = pm::World::createObject<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
                        ((World *)pMVar1,&local_10c,&local_118,&local_124,(Vector3 *)&rightWall);
  pm::Geometry::setMaterial(&local_100->super_Geometry,&green->super_Material);
  pMVar1 = vpSampler;
  pm::Vector3::Vector3(&local_144,0.0,0.0,0.0);
  pm::Vector3::Vector3(&local_150,0.0,548.8,0.0);
  pm::Vector3::Vector3(&local_15c,0.0,0.0,559.2);
  pm::Vector3::Vector3((Vector3 *)&backWall,1.0,0.0,0.0);
  local_138 = pm::World::createObject<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
                        ((World *)pMVar1,&local_144,&local_150,&local_15c,(Vector3 *)&backWall);
  pm::Geometry::setMaterial(&local_138->super_Geometry,&emissive->super_Material);
  pMVar1 = vpSampler;
  pm::Vector3::Vector3(&local_17c,0.0,0.0,559.2);
  pm::Vector3::Vector3(&local_188,0.0,548.8,0.0);
  pm::Vector3::Vector3(&local_194,556.0,0.0,0.0);
  pm::Vector3::Vector3((Vector3 *)&short1,0.0,0.0,-1.0);
  local_170 = pm::World::createObject<pm::Rectangle,pm::Vector3,pm::Vector3,pm::Vector3,pm::Vector3>
                        ((World *)pMVar1,&local_17c,&local_188,&local_194,(Vector3 *)&short1);
  pm::Geometry::setMaterial(&local_170->super_Geometry,&red->super_Material);
  pm::Vector3::Vector3(&local_1b4,130.0,165.0,65.0);
  pm::Vector3::Vector3(&local_1c0,82.0,165.0,225.0);
  pm::Vector3::Vector3(&local_1cc,290.0,165.0,114.0);
  rectangleFromVertices((Vector3 *)local_1a8,&local_1b4,&local_1c0);
  pRVar5 = std::unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>::operator->
                     ((unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_1a8);
  pm::Geometry::setMaterial(&pRVar5->super_Geometry,&red->super_Material);
  pMVar1 = vpSampler;
  std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>::
  unique_ptr<pm::Rectangle,std::default_delete<pm::Rectangle>,void>
            ((unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>> *)&short2,
             (unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_1a8);
  pm::World::addObject
            ((World *)pMVar1,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&short2
            );
  std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>::~unique_ptr
            ((unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&short2);
  pm::Vector3::Vector3(&local_1fc,290.0,0.0,114.0);
  pm::Vector3::Vector3(&local_208,290.0,165.0,114.0);
  pm::Vector3::Vector3(&local_214,240.0,0.0,272.0);
  rectangleFromVertices((Vector3 *)local_1f0,&local_1fc,&local_208);
  pRVar5 = std::unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>::operator->
                     ((unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_1f0);
  pm::Geometry::setMaterial(&pRVar5->super_Geometry,&red->super_Material);
  pMVar1 = vpSampler;
  std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>::
  unique_ptr<pm::Rectangle,std::default_delete<pm::Rectangle>,void>
            ((unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>> *)&short3,
             (unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_1f0);
  pm::World::addObject
            ((World *)pMVar1,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&short3
            );
  std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>::~unique_ptr
            ((unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&short3);
  pm::Vector3::Vector3(&local_234,130.0,0.0,65.0);
  pm::Vector3::Vector3(&local_240,130.0,165.0,65.0);
  pm::Vector3::Vector3(&local_24c,290.0,0.0,114.0);
  rectangleFromVertices((Vector3 *)local_228,&local_234,&local_240);
  pRVar5 = std::unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>::operator->
                     ((unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_228);
  pm::Geometry::setMaterial(&pRVar5->super_Geometry,&red->super_Material);
  pMVar1 = vpSampler;
  std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>::
  unique_ptr<pm::Rectangle,std::default_delete<pm::Rectangle>,void>
            ((unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>> *)&short4,
             (unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_228);
  pm::World::addObject
            ((World *)pMVar1,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&short4
            );
  std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>::~unique_ptr
            ((unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&short4);
  pm::Vector3::Vector3(&local_26c,82.0,0.0,225.0);
  pm::Vector3::Vector3(&local_278,82.0,165.0,225.0);
  pm::Vector3::Vector3(&local_284,130.0,0.0,65.0);
  rectangleFromVertices((Vector3 *)local_260,&local_26c,&local_278);
  pRVar5 = std::unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>::operator->
                     ((unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_260);
  pm::Geometry::setMaterial(&pRVar5->super_Geometry,&red->super_Material);
  pMVar1 = vpSampler;
  std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>::
  unique_ptr<pm::Rectangle,std::default_delete<pm::Rectangle>,void>
            ((unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>> *)&short5,
             (unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_260);
  pm::World::addObject
            ((World *)pMVar1,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&short5
            );
  std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>::~unique_ptr
            ((unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&short5);
  pm::Vector3::Vector3(&local_2a4,240.0,0.0,272.0);
  pm::Vector3::Vector3(&local_2b0,240.0,165.0,272.0);
  pm::Vector3::Vector3(&local_2bc,82.0,0.0,225.0);
  rectangleFromVertices((Vector3 *)local_298,&local_2a4,&local_2b0);
  pRVar5 = std::unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>::operator->
                     ((unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_298);
  pm::Geometry::setMaterial(&pRVar5->super_Geometry,&red->super_Material);
  pMVar1 = vpSampler;
  std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>::
  unique_ptr<pm::Rectangle,std::default_delete<pm::Rectangle>,void>
            ((unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>> *)&tall1,
             (unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_298);
  pm::World::addObject
            ((World *)pMVar1,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&tall1)
  ;
  std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>::~unique_ptr
            ((unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&tall1);
  pm::Vector3::Vector3(&local_2dc,423.0,330.0,247.0);
  pm::Vector3::Vector3(&local_2e8,265.0,330.0,296.0);
  pm::Vector3::Vector3(&local_2f4,472.0,330.0,406.0);
  rectangleFromVertices((Vector3 *)local_2d0,&local_2dc,&local_2e8);
  pRVar5 = std::unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>::operator->
                     ((unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_2d0);
  pm::Geometry::setMaterial(&pRVar5->super_Geometry,&red->super_Material);
  pMVar1 = vpSampler;
  std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>::
  unique_ptr<pm::Rectangle,std::default_delete<pm::Rectangle>,void>
            ((unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>> *)&tall2,
             (unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_2d0);
  pm::World::addObject
            ((World *)pMVar1,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&tall2)
  ;
  std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>::~unique_ptr
            ((unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&tall2);
  pm::Vector3::Vector3(&local_314,423.0,0.0,247.0);
  pm::Vector3::Vector3(&local_320,423.0,330.0,247.0);
  pm::Vector3::Vector3(&local_32c,472.0,0.0,406.0);
  rectangleFromVertices((Vector3 *)local_308,&local_314,&local_320);
  pRVar5 = std::unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>::operator->
                     ((unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_308);
  pm::Geometry::setMaterial(&pRVar5->super_Geometry,&red->super_Material);
  pMVar1 = vpSampler;
  std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>::
  unique_ptr<pm::Rectangle,std::default_delete<pm::Rectangle>,void>
            ((unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>> *)&tall3,
             (unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_308);
  pm::World::addObject
            ((World *)pMVar1,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&tall3)
  ;
  std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>::~unique_ptr
            ((unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&tall3);
  pm::Vector3::Vector3(&local_34c,472.0,0.0,406.0);
  pm::Vector3::Vector3(&local_358,472.0,330.0,406.0);
  pm::Vector3::Vector3(&local_364,314.0,0.0,456.0);
  rectangleFromVertices((Vector3 *)local_340,&local_34c,&local_358);
  pRVar5 = std::unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>::operator->
                     ((unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_340);
  pm::Geometry::setMaterial(&pRVar5->super_Geometry,&red->super_Material);
  pMVar1 = vpSampler;
  std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>::
  unique_ptr<pm::Rectangle,std::default_delete<pm::Rectangle>,void>
            ((unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>> *)&tall4,
             (unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_340);
  pm::World::addObject
            ((World *)pMVar1,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&tall4)
  ;
  std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>::~unique_ptr
            ((unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&tall4);
  pm::Vector3::Vector3(&local_384,314.0,0.0,456.0);
  pm::Vector3::Vector3(&local_390,314.0,330.0,456.0);
  pm::Vector3::Vector3(&local_39c,265.0,0.0,296.0);
  rectangleFromVertices((Vector3 *)local_378,&local_384,&local_390);
  pRVar5 = std::unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>::operator->
                     ((unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_378);
  pm::Geometry::setMaterial(&pRVar5->super_Geometry,&red->super_Material);
  pMVar1 = vpSampler;
  std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>::
  unique_ptr<pm::Rectangle,std::default_delete<pm::Rectangle>,void>
            ((unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>> *)&tall5,
             (unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_378);
  pm::World::addObject
            ((World *)pMVar1,(unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&tall5)
  ;
  std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>::~unique_ptr
            ((unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_> *)&tall5);
  pm::Vector3::Vector3(&local_3bc,265.0,0.0,296.0);
  pm::Vector3::Vector3(&local_3c8,265.0,330.0,296.0);
  pm::Vector3::Vector3(&local_3d4,423.0,0.0,247.0);
  rectangleFromVertices((Vector3 *)local_3b0,&local_3bc,&local_3c8);
  pRVar5 = std::unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>::operator->
                     ((unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_3b0);
  pm::Geometry::setMaterial(&pRVar5->super_Geometry,&red->super_Material);
  pMVar1 = vpSampler;
  std::unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>>::
  unique_ptr<pm::Rectangle,std::default_delete<pm::Rectangle>,void>
            ((unique_ptr<pm::Geometry,std::default_delete<pm::Geometry>> *)&local_3e0,
             (unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_3b0);
  pm::World::addObject((World *)pMVar1,&local_3e0);
  std::unique_ptr<pm::Geometry,_std::default_delete<pm::Geometry>_>::~unique_ptr(&local_3e0);
  std::unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>::~unique_ptr
            ((unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_3b0);
  std::unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>::~unique_ptr
            ((unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_378);
  std::unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>::~unique_ptr
            ((unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_340);
  std::unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>::~unique_ptr
            ((unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_308);
  std::unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>::~unique_ptr
            ((unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_2d0);
  std::unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>::~unique_ptr
            ((unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_298);
  std::unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>::~unique_ptr
            ((unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_260);
  std::unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>::~unique_ptr
            ((unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_228);
  std::unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>::~unique_ptr
            ((unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_1f0);
  std::unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_>::~unique_ptr
            ((unique_ptr<pm::Rectangle,_std::default_delete<pm::Rectangle>_> *)local_1a8);
  return;
}

Assistant:

void setupCornellBox(pm::World &world)
{
	auto vpSampler = world.createSampler<pm::MultiJittered>(9);

	world.viewPlane().setDimensions(Width, Height);
	world.viewPlane().setSampler(vpSampler);
	world.viewPlane().editMaxDepth() = 5;

	auto hammersley = world.createSampler<pm::Hammersley>(256);

	// Materials
	auto white = world.createMaterial<pm::Matte>();
	white->setCd(0.7f, 0.7f, 0.7f);
	white->ambient().setSampler(hammersley);
	white->diffuse().setSampler(hammersley);

	auto red = world.createMaterial<pm::Matte>();
	red->setCd(0.7f, 0.0f, 0.0f);
	red->ambient().setSampler(hammersley);
	red->diffuse().setSampler(hammersley);

	auto green = world.createMaterial<pm::Matte>();
	green->setCd(0.0f, 0.7f, 0.0f);
	green->ambient().setSampler(hammersley);
	green->diffuse().setSampler(hammersley);

	auto emissive = world.createMaterial<pm::Emissive>();

	// Light
	auto lightRect = world.createObject<pm::Rectangle>(pm::Vector3(213.0f, 548.79f, 227.0f), pm::Vector3(343.0f - 213.0f, 0.0f, 0.0f), pm::Vector3(0.0f, 0.0f, 332.0f - 227.0f), pm::Vector3(0.0f, -1.0f, 0.0f));
	lightRect->setSampler(hammersley);
	lightRect->setMaterial(emissive);

	// Walls
	auto floor = world.createObject<pm::Rectangle>(pm::Vector3(0.0f, 0.0f, 0.0f), pm::Vector3(552.8f, 0.0f, 0.0f), pm::Vector3(0.0f, 0.0f, 559.2f), pm::Vector3(0.0f, 1.0f, 0.0f));
	floor->setMaterial(white);

	auto ceiling = world.createObject<pm::Rectangle>(pm::Vector3(0.0f, 548.8f, 0.0f), pm::Vector3(556.0f, 0.0f, 0.0f), pm::Vector3(0.0f, 0.0f, 559.2f), pm::Vector3(0.0f, -1.0f, 0.0f));
	ceiling->setMaterial(white);

	auto leftWall = world.createObject<pm::Rectangle>(pm::Vector3(552.8f, 0.0f, 0.0f), pm::Vector3(0.0f, 548.8f, 0.0f), pm::Vector3(0.0f, 0.0f, 559.2f), pm::Vector3(-1.0f, 0.0f, 0.0f));
	leftWall->setMaterial(red);

	auto rightWall = world.createObject<pm::Rectangle>(pm::Vector3(0.0f, 0.0f, 0.0f), pm::Vector3(0.0f, 548.8f, 0.0f), pm::Vector3(0.0f, 0.0f, 559.2f), pm::Vector3(1.0f, 0.0f, 0.0f));
	rightWall->setMaterial(green);

	auto backWall = world.createObject<pm::Rectangle>(pm::Vector3(0.0f, 0.0f, 559.2f), pm::Vector3(0.0f, 548.8f, 0.0f), pm::Vector3(556.0f, 0.0f, 0.0f), pm::Vector3(0.0f, 0.0f, -1.0f));
	backWall->setMaterial(white);

	// Short object
	auto short1 = rectangleFromVertices(pm::Vector3(130.0f, 165.0f, 65.0f), pm::Vector3(82.0f, 165.0f, 225.0f), pm::Vector3(290.0f, 165.0f, 114.0f));
	short1->setMaterial(white);
	world.addObject(std::move(short1));

	auto short2 = rectangleFromVertices(pm::Vector3(290.0f, 0.0f, 114.0f), pm::Vector3(290.0f, 165.0f, 114.0f), pm::Vector3(240.0f, 0.0f, 272.0f));
	short2->setMaterial(white);
	world.addObject(std::move(short2));

	auto short3 = rectangleFromVertices(pm::Vector3(130.0f, 0.0f, 65.0f), pm::Vector3(130.0f, 165.0f, 65.0f), pm::Vector3(290.0f, 0.0f, 114.0f));
	short3->setMaterial(white);
	world.addObject(std::move(short3));

	auto short4 = rectangleFromVertices(pm::Vector3(82.0f, 0.0f, 225.0f), pm::Vector3(82.0f, 165.0f, 225.0f), pm::Vector3(130.0f, 0.0f, 65.0f));
	short4->setMaterial(white);
	world.addObject(std::move(short4));

	auto short5 = rectangleFromVertices(pm::Vector3(240.0f, 0.0f, 272.0f), pm::Vector3(240.0f, 165.0f, 272.0f), pm::Vector3(82.0f, 0.0f, 225.0f));
	short5->setMaterial(white);
	world.addObject(std::move(short5));

	// Tall object
	auto tall1 = rectangleFromVertices(pm::Vector3(423.0f, 330.0f, 247.0f), pm::Vector3(265.0f, 330.0f, 296.0f), pm::Vector3(472.0f, 330.0f, 406.0f));
	tall1->setMaterial(white);
	world.addObject(std::move(tall1));

	auto tall2 = rectangleFromVertices(pm::Vector3(423.0f, 0.0f, 247.0f), pm::Vector3(423.0f, 330.0f, 247.0f), pm::Vector3(472.0f, 0.0f, 406.0f));
	tall2->setMaterial(white);
	world.addObject(std::move(tall2));

	auto tall3 = rectangleFromVertices(pm::Vector3(472.0f, 0.0f, 406.0f), pm::Vector3(472.0f, 330.0f, 406.0f), pm::Vector3(314.0f, 0.0f, 456.0f));
	tall3->setMaterial(white);
	world.addObject(std::move(tall3));

	auto tall4 = rectangleFromVertices(pm::Vector3(314.0f, 0.0f, 456.0f), pm::Vector3(314.0f, 330.0f, 456.0f), pm::Vector3(265.0f, 0.0f, 296.0f));
	tall4->setMaterial(white);
	world.addObject(std::move(tall4));

	auto tall5 = rectangleFromVertices(pm::Vector3(265.0f, 0.0f, 296.0f), pm::Vector3(265.0f, 330.0f, 296.0f), pm::Vector3(423.0f, 0.0f, 247.0f));
	tall5->setMaterial(white);
	world.addObject(std::move(tall5));
}